

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

void __thiscall QNetworkRequestFactory::setBaseUrl(QNetworkRequestFactory *this,QUrl *url)

{
  char cVar1;
  
  cVar1 = comparesEqual(&((this->d).d.ptr)->baseUrl,url);
  if (cVar1 != '\0') {
    return;
  }
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
  QUrl::operator=(&((this->d).d.ptr)->baseUrl,url);
  return;
}

Assistant:

void QNetworkRequestFactory::setBaseUrl(const QUrl &url)
{
    if (d->baseUrl == url)
        return;

    d.detach();
    d->baseUrl = url;
}